

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_intersector_virtual_8i_mb.cpp
# Opt level: O2

VirtualCurveIntersector * embree::avx2::VirtualCurveIntersector8iMB(void)

{
  int iVar1;
  
  if ((VirtualCurveIntersector8iMB()::function_local_static_prim == '\0') &&
     (iVar1 = __cxa_guard_acquire(&VirtualCurveIntersector8iMB()::function_local_static_prim),
     iVar1 != 0)) {
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x19].intersect1 =
         SphereMiMBIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x19].occluded1 =
         SphereMiMBIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x19].intersect4 =
         SphereMiMBIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x19].occluded4 =
         SphereMiMBIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x19].intersect8 =
         SphereMiMBIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x19].occluded8 =
         SphereMiMBIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1a].intersect1 =
         DiscMiMBIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1a].occluded1 =
         DiscMiMBIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1a].intersect4 =
         DiscMiMBIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1a].occluded4 =
         DiscMiMBIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1a].intersect8 =
         DiscMiMBIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1a].occluded8 =
         DiscMiMBIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1b].intersect1 =
         OrientedDiscMiMBIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1b].occluded1 =
         OrientedDiscMiMBIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1b].intersect4 =
         OrientedDiscMiMBIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1b].occluded4 =
         OrientedDiscMiMBIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1b].intersect8 =
         OrientedDiscMiMBIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x1b].occluded8 =
         OrientedDiscMiMBIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[3].intersect1 =
         ConeCurveMiMBIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[3].occluded1 =
         ConeCurveMiMBIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[3].intersect4 =
         ConeCurveMiMBIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[3].occluded4 =
         ConeCurveMiMBIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[3].intersect8 =
         ConeCurveMiMBIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[3].occluded8 =
         ConeCurveMiMBIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[1].intersect1 =
         RoundLinearCurveMiMBIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[1].occluded1 =
         RoundLinearCurveMiMBIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[1].intersect4 =
         RoundLinearCurveMiMBIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[1].occluded4 =
         RoundLinearCurveMiMBIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[1].intersect8 =
         RoundLinearCurveMiMBIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[1].occluded8 =
         RoundLinearCurveMiMBIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0].intersect1 =
         FlatLinearCurveMiMBIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0].occluded1 =
         FlatLinearCurveMiMBIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0].intersect4 =
         FlatLinearCurveMiMBIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0].occluded4 =
         FlatLinearCurveMiMBIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0].intersect8 =
         FlatLinearCurveMiMBIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0].occluded8 =
         FlatLinearCurveMiMBIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[5].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[5].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[5].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[5].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[5].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[5].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[4].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[4].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[4].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[4].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[4].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[4].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[6].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[6].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[6].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[6].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[6].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[6].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[9].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[9].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[9].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[9].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[9].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[9].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[8].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[8].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[8].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[8].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[8].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[8].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[10].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[10].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[10].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[10].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[10].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[10].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xd].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_h<embree::avx2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xd].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_h<embree::avx2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xd].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xd].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xd].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xd].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xc].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_h<embree::avx2::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xc].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_h<embree::avx2::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xc].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xc].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xc].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xc].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xe].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xe].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_hn<embree::avx2::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xe].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xe].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xe].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0xe].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x11].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x11].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x11].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x11].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x11].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x11].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x10].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x10].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x10].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x10].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x10].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x10].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x12].intersect1 =
         CurveNiMBIntersector1<8>::
         intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x12].occluded1 =
         CurveNiMBIntersector1<8>::
         occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x12].intersect4 =
         CurveNiMBIntersectorK<8,4>::
         intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x12].occluded4 =
         CurveNiMBIntersectorK<8,4>::
         occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x12].intersect8 =
         CurveNiMBIntersectorK<8,8>::
         intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8iMB::function_local_static_prim.vtbl[0x12].occluded8 =
         CurveNiMBIntersectorK<8,8>::
         occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
    ;
    __cxa_guard_release(&VirtualCurveIntersector8iMB()::function_local_static_prim);
  }
  return &VirtualCurveIntersector8iMB::function_local_static_prim;
}

Assistant:

VirtualCurveIntersector* VirtualCurveIntersector8iMB()
    {
      static VirtualCurveIntersector function_local_static_prim = []()
      {
        VirtualCurveIntersector intersector;
        intersector.vtbl[Geometry::GTY_SPHERE_POINT] = SphereNiMBIntersectors<8>();
        intersector.vtbl[Geometry::GTY_DISC_POINT] = DiscNiMBIntersectors<8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_DISC_POINT] = OrientedDiscNiMBIntersectors<8>();
        intersector.vtbl[Geometry::GTY_CONE_LINEAR_CURVE ] = LinearConeNiMBIntersectors<8>();
        intersector.vtbl[Geometry::GTY_ROUND_LINEAR_CURVE ] = LinearRoundConeNiMBIntersectors<8>();
        intersector.vtbl[Geometry::GTY_FLAT_LINEAR_CURVE ] = LinearRibbonNiMBIntersectors<8>();
        intersector.vtbl[Geometry::GTY_ROUND_BEZIER_CURVE] = CurveNiMBIntersectors <BezierCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_BEZIER_CURVE ] = RibbonNiMBIntersectors<BezierCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_BEZIER_CURVE] = OrientedCurveNiMBIntersectors<BezierCurveT,8>();
        intersector.vtbl[Geometry::GTY_ROUND_BSPLINE_CURVE] = CurveNiMBIntersectors <BSplineCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_BSPLINE_CURVE ] = RibbonNiMBIntersectors<BSplineCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_BSPLINE_CURVE] = OrientedCurveNiMBIntersectors<BSplineCurveT,8>();
        intersector.vtbl[Geometry::GTY_ROUND_HERMITE_CURVE] = HermiteCurveNiMBIntersectors <HermiteCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_HERMITE_CURVE ] = HermiteRibbonNiMBIntersectors<HermiteCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_HERMITE_CURVE] = HermiteOrientedCurveNiMBIntersectors<HermiteCurveT,8>();
        intersector.vtbl[Geometry::GTY_ROUND_CATMULL_ROM_CURVE] = CurveNiMBIntersectors <CatmullRomCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_CATMULL_ROM_CURVE ] = RibbonNiMBIntersectors<CatmullRomCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_CATMULL_ROM_CURVE] = OrientedCurveNiMBIntersectors<CatmullRomCurveT,8>();
        return intersector;
      }();
      return &function_local_static_prim;
    }